

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

int __thiscall MeCab::POSIDGenerator::open(POSIDGenerator *this,char *__file,int __oflag,...)

{
  byte bVar1;
  bool bVar2;
  ostream *dst;
  istream *piVar3;
  ostream *poVar4;
  undefined8 uVar5;
  char *p;
  size_t n;
  char *col [2];
  string line;
  ifstream ifs;
  ostream *in_stack_fffffffffffffcd0;
  Iconv *in_stack_fffffffffffffcd8;
  ostream *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  ostream *in_stack_fffffffffffffd08;
  ostream *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  die local_281;
  char *local_280;
  byte local_272;
  die local_271;
  size_t local_270;
  char *local_260;
  string local_258 [32];
  undefined4 local_238;
  long local_228 [65];
  long local_20;
  char *local_18;
  POSIDGenerator *local_10;
  undefined1 local_1;
  
  local_20 = ___oflag;
  local_18 = __file;
  local_10 = this;
  std::ifstream::ifstream(local_228,__file,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      if (local_20 != 0) {
        Iconv::convert(in_stack_fffffffffffffcd8,(string *)in_stack_fffffffffffffcd0);
      }
      std::__cxx11::string::c_str();
      local_270 = tokenize2<char**>((char *)in_stack_fffffffffffffd10,
                                    (char *)in_stack_fffffffffffffd08,
                                    (char **)in_stack_fffffffffffffd00,
                                    (size_t)in_stack_fffffffffffffcf8);
      local_272 = 0;
      if (local_270 != 2) {
        die::die(&local_271);
        local_272 = 1;
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xdb);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,"n == 2");
        poVar4 = std::operator<<(poVar4,"] ");
        in_stack_fffffffffffffd10 = std::operator<<(poVar4,"format error: ");
        in_stack_fffffffffffffd08 = std::operator<<(in_stack_fffffffffffffd10,local_258);
        die::operator&(&local_271,in_stack_fffffffffffffd08);
      }
      if ((local_272 & 1) != 0) {
        die::~die((die *)0x143335);
      }
      for (local_280 = local_260; *local_280 != '\0'; local_280 = local_280 + 1) {
        bVar2 = false;
        if ((*local_280 < '0') || ('9' < *local_280)) {
          die::die(&local_281);
          bVar2 = true;
          in_stack_fffffffffffffd00 =
               std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                              );
          in_stack_fffffffffffffcf8 = std::operator<<(in_stack_fffffffffffffd00,"(");
          in_stack_fffffffffffffcf0 =
               (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcf8,0xdd);
          in_stack_fffffffffffffce8 = std::operator<<(in_stack_fffffffffffffcf0,") [");
          poVar4 = std::operator<<(in_stack_fffffffffffffce8,"*p >= \'0\' && *p <= \'9\'");
          in_stack_fffffffffffffcd8 = (Iconv *)std::operator<<(poVar4,"] ");
          in_stack_fffffffffffffcd0 =
               std::operator<<((ostream *)in_stack_fffffffffffffcd8,"not a number: ");
          poVar4 = std::operator<<(in_stack_fffffffffffffcd0,local_260);
          die::operator&(&local_281,poVar4);
        }
        if (bVar2) {
          die::~die((die *)0x143488);
        }
      }
      std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::size
                ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this);
      std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
                ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
                 in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8);
      std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::back
                ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
                 in_stack_fffffffffffffcd0);
      RewritePattern::set_pattern
                ((RewritePattern *)this,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    }
    local_1 = 1;
    local_238 = 1;
    std::__cxx11::string::~string(local_258);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,local_18);
    dst = std::operator<<(poVar4," is not found. minimum setting is used");
    std::ostream::operator<<(dst,std::endl<char,std::char_traits<char>>);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
              ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
               in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::back
              ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
               in_stack_fffffffffffffcd0);
    RewritePattern::set_pattern((RewritePattern *)this,(char *)poVar4,(char *)dst);
    local_1 = 1;
    local_238 = 1;
  }
  uVar5 = std::ifstream::~ifstream(local_228);
  return (uint)CONCAT71((int7)((ulong)uVar5 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool POSIDGenerator::open(const char *filename,
                          Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    std::cerr << filename
              << " is not found. minimum setting is used" << std::endl;
    rewrite_.resize(1);
    rewrite_.back().set_pattern("*", "1");
    return true;
  }

  std::string line;
  char *col[2];
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    const size_t n = tokenize2(const_cast<char *>(line.c_str()),
                               " \t", col, 2);
    CHECK_DIE(n == 2) << "format error: " << line;
    for (char *p = col[1]; *p; ++p) {
      CHECK_DIE(*p >= '0' && *p <= '9') << "not a number: " << col[1];
    }
    rewrite_.resize(rewrite_.size() + 1);
    rewrite_.back().set_pattern(col[0], col[1]);
  }
  return true;
}